

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executable.cpp
# Opt level: O3

void __thiscall
Executable::Executable(Executable *this,AbstractByteBuffer *v_buf,exe_bits v_bitMode)

{
  ExeException *this_00;
  QString local_30;
  
  (this->super_AbstractByteBuffer)._vptr_AbstractByteBuffer =
       (_func_int **)&PTR__AbstractByteBuffer_001528f0;
  this->bitMode = v_bitMode;
  this->buf = v_buf;
  if (v_buf != (AbstractByteBuffer *)0x0) {
    return;
  }
  this_00 = (ExeException *)__cxa_allocate_exception(0x48);
  QString::QString(&local_30,"Cannot make an Exe from NULL buffer");
  ExeException::ExeException(this_00,&local_30);
  __cxa_throw(this_00,&ExeException::typeinfo,CustomException::~CustomException);
}

Assistant:

Executable::Executable(AbstractByteBuffer *v_buf, exe_bits v_bitMode)
    : buf(v_buf), bitMode(v_bitMode)
{
    if (!v_buf) throw ExeException("Cannot make an Exe from NULL buffer");
}